

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O3

void __thiscall HFactor::copyFrom(HFactor *this,HFactor *from)

{
  int *piVar1;
  int iVar2;
  
  iVar2 = from->numCol;
  this->numRow = from->numRow;
  this->numCol = iVar2;
  piVar1 = from->Aindex;
  this->Astart = from->Astart;
  this->Aindex = piVar1;
  piVar1 = from->baseIndex;
  this->Avalue = from->Avalue;
  this->baseIndex = piVar1;
  iVar2 = from->nwork;
  this->updateMethod = from->updateMethod;
  this->nwork = iVar2;
  std::vector<int,_std::allocator<int>_>::operator=(&this->iwork,&from->iwork);
  std::vector<double,_std::allocator<double>_>::operator=(&this->dwork,&from->dwork);
  std::vector<int,_std::allocator<int>_>::operator=(&this->LpivotLookup,&from->LpivotLookup);
  std::vector<int,_std::allocator<int>_>::operator=(&this->LpivotIndex,&from->LpivotIndex);
  std::vector<int,_std::allocator<int>_>::operator=(&this->Lstart,&from->Lstart);
  std::vector<int,_std::allocator<int>_>::operator=(&this->Lindex,&from->Lindex);
  std::vector<double,_std::allocator<double>_>::operator=(&this->Lvalue,&from->Lvalue);
  std::vector<int,_std::allocator<int>_>::operator=(&this->LRstart,&from->LRstart);
  std::vector<int,_std::allocator<int>_>::operator=(&this->LRindex,&from->LRindex);
  std::vector<double,_std::allocator<double>_>::operator=(&this->LRvalue,&from->LRvalue);
  std::vector<int,_std::allocator<int>_>::operator=(&this->UpivotLookup,&from->UpivotLookup);
  std::vector<int,_std::allocator<int>_>::operator=(&this->UpivotIndex,&from->UpivotIndex);
  std::vector<double,_std::allocator<double>_>::operator=(&this->UpivotValue,&from->UpivotValue);
  iVar2 = from->UtotalX;
  this->UmeritX = from->UmeritX;
  this->UtotalX = iVar2;
  std::vector<int,_std::allocator<int>_>::operator=(&this->Ustart,&from->Ustart);
  std::vector<int,_std::allocator<int>_>::operator=(&this->Ulastp,&from->Ulastp);
  std::vector<int,_std::allocator<int>_>::operator=(&this->Uindex,&from->Uindex);
  std::vector<double,_std::allocator<double>_>::operator=(&this->Uvalue,&from->Uvalue);
  std::vector<int,_std::allocator<int>_>::operator=(&this->URstart,&from->URstart);
  std::vector<int,_std::allocator<int>_>::operator=(&this->URlastp,&from->URlastp);
  std::vector<int,_std::allocator<int>_>::operator=(&this->URspace,&from->URspace);
  std::vector<int,_std::allocator<int>_>::operator=(&this->URindex,&from->URindex);
  std::vector<double,_std::allocator<double>_>::operator=(&this->URvalue,&from->URvalue);
  std::vector<double,_std::allocator<double>_>::operator=(&this->PFpivotValue,&from->PFpivotValue);
  std::vector<int,_std::allocator<int>_>::operator=(&this->PFpivotIndex,&from->PFpivotIndex);
  std::vector<int,_std::allocator<int>_>::operator=(&this->PFstart,&from->PFstart);
  std::vector<int,_std::allocator<int>_>::operator=(&this->PFindex,&from->PFindex);
  std::vector<double,_std::allocator<double>_>::operator=(&this->PFvalue,&from->PFvalue);
  return;
}

Assistant:

void HFactor::copyFrom(const HFactor *from) {
    numRow = from->numRow;
    numCol = from->numCol;
    Astart = from->Astart;
    Aindex = from->Aindex;
    Avalue = from->Avalue;
    baseIndex = from->baseIndex;
    updateMethod = from->updateMethod;

    nwork = from->nwork;
    iwork = from->iwork;
    dwork = from->dwork;

    LpivotLookup = from->LpivotLookup;
    LpivotIndex = from->LpivotIndex;
    Lstart = from->Lstart;
    Lindex = from->Lindex;
    Lvalue = from->Lvalue;
    LRstart = from->LRstart;
    LRindex = from->LRindex;
    LRvalue = from->LRvalue;

    UpivotLookup = from->UpivotLookup;
    UpivotIndex = from->UpivotIndex;
    UpivotValue = from->UpivotValue;
    UmeritX = from->UmeritX;
    UtotalX = from->UtotalX;
    Ustart = from->Ustart;
    Ulastp = from->Ulastp;
    Uindex = from->Uindex;
    Uvalue = from->Uvalue;
    URstart = from->URstart;
    URlastp = from->URlastp;
    URspace = from->URspace;
    URindex = from->URindex;
    URvalue = from->URvalue;

    PFpivotValue = from->PFpivotValue;
    PFpivotIndex = from->PFpivotIndex;
    PFstart = from->PFstart;
    PFindex = from->PFindex;
    PFvalue = from->PFvalue;
}